

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *R,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  pointer pMVar1;
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pPVar2;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *pvVar3;
  pointer pMVar4;
  pointer pMVar5;
  uint uVar6;
  long lVar7;
  char *__assertion;
  XprTypeNested pMVar8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar9;
  int i;
  ulong uVar10;
  long lVar11;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_00;
  Scalar SVar12;
  long local_250;
  undefined1 local_228 [40];
  RhsNested local_200;
  RhsNested local_1f8;
  scalar_constant_op<double> local_1f0;
  type *local_1e8;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *local_1c8
  ;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *local_1c0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w;
  XprTypeNested local_198;
  long local_190;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w_d;
  undefined1 local_170 [40];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  n;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  F;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v_d;
  undefined1 local_f8 [24];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  f;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  N;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  vC_d;
  undefined1 local_98 [32];
  Matrix3d identity_mat;
  
  uVar10 = (ulong)this->JOINT_NUM;
  local_1c0 = R;
  if (((long)(R->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(R->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x48 == uVar10) {
    if (((long)(P->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(P->
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar10) {
      if ((long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == uVar10) {
        if ((long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 == uVar10) {
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&w,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&w_d,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&v_d,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&vC_d,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&F,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&N,(ulong)(this->JOINT_NUM + 1),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&f,(ulong)(this->JOINT_NUM + 2),(allocator_type *)local_228);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(&n,(ulong)(this->JOINT_NUM + 2),(allocator_type *)local_228);
          lVar7 = 0;
          for (uVar10 = 0; uVar6 = this->JOINT_NUM, uVar10 < uVar6 + 1; uVar10 = uVar10 + 1) {
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((w.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((w_d.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((v_d.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((vC_d.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((F.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((N.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            lVar7 = lVar7 + 0x18;
          }
          lVar7 = 0;
          for (uVar10 = 0; uVar10 < uVar6 + 2; uVar10 = uVar10 + 1) {
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((f.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((n.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            uVar6 = this->JOINT_NUM;
            lVar7 = lVar7 + 0x18;
          }
          local_1c8 = (vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                       *)P;
          std::vector<double,_std::allocator<double>_>::vector
                    (__return_storage_ptr__,(ulong)uVar6,(allocator_type *)local_228);
          local_98._0_8_ = 0.0;
          local_98._8_8_ = 0.0;
          local_98._16_8_ = 1.0;
          ((v_d.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
               0.0;
          ((v_d.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
               0.0;
          ((v_d.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
               G;
          local_250 = 0;
          lVar11 = 0;
          lVar7 = 0;
          uVar10 = 0;
          this_00 = local_1c0;
          while( true ) {
            pMVar4 = w.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (this->JOINT_NUM <= uVar10) break;
            pMVar1 = (this_00->
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              *)&identity_mat,
                             (double *)
                             ((long)(theta_d->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + local_250),
                             (StorageBaseType *)local_98);
            local_228._8_8_ =
                 (long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + lVar11;
            local_228._0_8_ =
                 (long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar7;
            local_228._32_8_ =
                 identity_mat.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[2];
            local_200 = (RhsNested)
                        identity_mat.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[3];
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)w.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)local_228);
            pMVar8 = (XprTypeNested)
                     ((long)&(((this_00->
                               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data + lVar7);
            pPVar2 = &(w_d.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
            local_190 = (long)((w.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar11;
            local_198 = pMVar8;
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              *)&identity_mat,
                             (double *)
                             ((long)(theta_d->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + local_250),
                             (StorageBaseType *)local_98);
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ::
            cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((type *)local_f8,&local_198,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&identity_mat);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              *)local_170,
                             (double *)
                             ((long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + local_250),
                             (StorageBaseType *)local_98);
            local_228._24_8_ = local_f8;
            local_1f0.m_other = (double)local_170._16_8_;
            local_1e8 = (type *)local_170._24_8_;
            local_228._8_8_ = pMVar8;
            local_228._16_8_ = (RhsNested)((long)(pPVar2->m_storage).m_data.array + lVar11);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)w_d.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)local_228);
            pvVar3 = local_1c8;
            pMVar1 = (this_00->
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((w_d.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar11),
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       (*(long *)local_1c8 + lVar11));
            pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     ((long)((w.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                            m_data.array + lVar11);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      (pMVar9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              (*(long *)pvVar3 + lVar11));
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      (pMVar9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_f8);
            local_200 = (RhsNested)
                        ((long)((v_d.
                                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + lVar11);
            local_228._0_8_ =
                 (long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar7;
            local_228._16_8_ = &identity_mat;
            local_228._24_8_ = local_170;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)v_d.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
                        *)local_228);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)w_d.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)&(((this->PC).
                                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data + lVar11));
            this_00 = local_1c0;
            pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     ((long)w.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array + lVar11);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      (pMVar9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              ((long)&(((this->PC).
                                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                      m_storage.m_data + lVar11));
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      (pMVar9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_f8);
            local_228._32_8_ =
                 (long)v_d.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar11;
            local_228._8_8_ = &identity_mat;
            local_228._16_8_ = local_170;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)vC_d.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        *)local_228);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              *)local_228,
                             (double *)
                             ((long)(this->m).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + local_250),
                             (StorageBaseType *)
                             ((long)vC_d.
                                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array + lVar11));
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)F.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        *)local_228);
            pMVar4 = w_d.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar8 = (XprTypeNested)
                     ((long)&(((this->I).
                               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data + lVar7);
            local_170._8_8_ =
                 (long)w.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar11;
            local_170._0_8_ = pMVar8;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      ((type *)&identity_mat,
                       (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_170._8_8_,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                        *)local_170);
            local_228._8_8_ =
                 (long)pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + lVar11;
            local_228._0_8_ = pMVar8;
            local_228._16_8_ = &identity_mat;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)N.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar11),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        *)local_228);
            lVar7 = lVar7 + 0x48;
            lVar11 = lVar11 + 0x18;
            local_250 = local_250 + 8;
            uVar10 = uVar10 + 1;
          }
          Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false>::run
                    (&identity_mat);
          std::
          vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ::push_back(this_00,&identity_mat);
          local_228._0_8_ = (XprTypeNested)0x0;
          local_228._8_8_ = (XprTypeNested)0x0;
          local_228._16_8_ = (RhsNested)0x0;
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                    (local_1c8,(Matrix<double,_3,_1,_0,_3,_1> *)local_228);
          uVar10 = (ulong)this->JOINT_NUM;
          lVar11 = uVar10 * 0x48;
          lVar7 = uVar10 * 0x18;
          while( true ) {
            if ((int)uVar10 < 1) break;
            local_228._0_8_ =
                 (long)&(((this_00->
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                        m_data + lVar11;
            local_228._8_8_ =
                 (long)f.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar7;
            local_228._16_8_ =
                 (long)((F.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar7;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)((f.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        *)local_228);
            pMVar5 = N.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar4 = n.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar1 = (this_00->
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Matrix<double,3,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)&(this->PC).
                               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data + lVar7),
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       ((long)((F.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7));
            local_198 = (XprTypeNested)
                        ((long)&(((this_00->
                                  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data + lVar11);
            local_190 = (long)f.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar7;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      ((type *)local_f8,
                       (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                       (*(long *)local_1c8 + lVar7 + -0x18 + 0x18),
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                        *)&local_198);
            local_228._16_8_ =
                 (long)(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + lVar7;
            local_228._32_8_ =
                 (long)pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + lVar7;
            local_1f8 = (RhsNested)local_170;
            local_228._24_8_ =
                 (LhsNested)
                 ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar11);
            local_1e8 = (type *)local_f8;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)
                       ((long)((n.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + lVar7),
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        *)local_228);
            local_228._0_8_ =
                 (long)((n.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar7;
            local_228._8_8_ = local_98;
            SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                               ((dense_product_base *)local_228);
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10 - 1] =
                 (this->damping).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10 - 1] *
                 (theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar10 - 1] + SVar12;
            lVar11 = lVar11 + -0x48;
            uVar10 = uVar10 - 1;
            this_00 = local_1c0;
            lVar7 = lVar7 + -0x18;
          }
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&n.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&f.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&N.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&F.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&vC_d.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&v_d.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&w_d.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~_Vector_base(&w.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         );
          return __return_storage_ptr__;
        }
        __assertion = "JOINT_NUM == theta_dd.size()";
        uVar6 = 0x1d;
      }
      else {
        __assertion = "JOINT_NUM == theta_d.size()";
        uVar6 = 0x1c;
      }
    }
    else {
      __assertion = "JOINT_NUM == P.size()";
      uVar6 = 0x1b;
    }
  }
  else {
    __assertion = "JOINT_NUM == R.size()";
    uVar6 = 0x1a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                ,uVar6,
                "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
               );
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Matrix3d> R, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    assert(JOINT_NUM == R.size());
    assert(JOINT_NUM == P.size());
    assert(JOINT_NUM == theta_d.size());
    assert(JOINT_NUM == theta_dd.size());

    vector<Eigen::Vector3d> w(JOINT_NUM + 1);
    vector<Eigen::Vector3d> w_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> v_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> vC_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> F(JOINT_NUM + 1);
    vector<Eigen::Vector3d> N(JOINT_NUM + 1);
    vector<Eigen::Vector3d> f(JOINT_NUM + 2);
    vector<Eigen::Vector3d> n(JOINT_NUM + 2);
    for (int i = 0; i < JOINT_NUM + 1; i++)
    {
        w[i].setZero();
        w_d[i].setZero();
        v_d[i].setZero();
        vC_d[i].setZero();
        F[i].setZero();
        N[i].setZero();
    }
    for (int i = 0; i < JOINT_NUM + 2; i++)
    {
        f[i].setZero();
        n[i].setZero();
    }
    vector<double> tau(JOINT_NUM);
    Eigen::Vector3d Z(0, 0, 1);
    v_d[0] = Eigen::Vector3d(0, 0, G);
    for (int i = 0; i < JOINT_NUM; i++)
    {
        w[i + 1] = R[i].inverse() * w[i] + theta_d[i] * Z;
        w_d[i + 1] = R[i].inverse() * w_d[i] + (R[i].inverse() * w[i]).cross(theta_d[i] * Z) + theta_dd[i] * Z;
        v_d[i + 1] = R[i].inverse() * (w_d[i].cross(P[i]) + w[i].cross(w[i].cross(P[i])) + v_d[i]);
        vC_d[i + 1] = w_d[i + 1].cross(PC[i]) + w[i + 1].cross(w[i + 1].cross(PC[i])) + v_d[i + 1];
        F[i + 1] = m[i] * vC_d[i + 1];
        N[i + 1] = I[i] * w_d[i + 1] + w[i + 1].cross(I[i] * w[i + 1]);
    }
    Eigen::Matrix3d identity_mat;
    identity_mat.setIdentity();
    R.push_back(identity_mat);
    P.push_back(Eigen::Vector3d(0, 0, 0));
    for (int i = JOINT_NUM; i >= 1; i--)
    {
        f[i] = R[i] * f[i + 1] + F[i];
        n[i] = N[i] + R[i] * n[i + 1] + PC[i - 1].cross(F[i]) + P[i].cross(R[i] * f[i + 1]);
        tau[i - 1] = n[i].transpose() * Z + damping[i - 1] * theta_d[i - 1];
    }
    return tau;
}